

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

char * __thiscall
google::protobuf::FileDescriptorProto::_InternalParse
          (FileDescriptorProto *this,char *ptr,ParseContext *ctx)

{
  InternalMetadataWithArena *metadata;
  ArenaStringPtr *this_00;
  ArenaStringPtr *this_01;
  ArenaStringPtr *this_02;
  byte bVar1;
  byte bVar2;
  int iVar3;
  Rep *pRVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [12];
  undefined1 auVar8 [12];
  EnumDescriptorProto *msg;
  string *s;
  DescriptorProto *msg_00;
  FileOptions *pFVar9;
  ServiceDescriptorProto *msg_01;
  FieldDescriptorProto *msg_02;
  SourceCodeInfo *pSVar10;
  char cVar11;
  uint32 uVar12;
  uint tag;
  Arena *pAVar13;
  ArenaStringPtr *pAVar14;
  RepeatedField<int> *object;
  byte *p;
  pair<const_char_*,_unsigned_int> pVar15;
  pair<const_char_*,_unsigned_long> pVar16;
  pair<const_char_*,_bool> pVar17;
  
  metadata = &this->_internal_metadata_;
  this_00 = &this->syntax_;
  this_01 = &this->package_;
  this_02 = &this->name_;
  do {
    if (ptr < (ctx->super_EpsCopyInputStream).limit_end_) {
      pVar17._8_8_ = 0;
      pVar17.first = ptr;
    }
    else {
      pVar17._8_8_ = 1;
      pVar17.first = ptr;
      if ((long)ptr - (long)(ctx->super_EpsCopyInputStream).buffer_end_ !=
          (long)(ctx->super_EpsCopyInputStream).limit_) {
        pVar17 = internal::EpsCopyInputStream::DoneFallback
                           (&ctx->super_EpsCopyInputStream,ptr,ctx->group_depth_);
      }
    }
    p = (byte *)pVar17.first;
    if (((undefined1  [16])pVar17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      return (char *)p;
    }
    bVar1 = *p;
    pVar15.second._0_1_ = bVar1;
    pVar15.first = (char *)(p + 1);
    pVar15._9_7_ = 0;
    if ((char)bVar1 < '\0') {
      bVar2 = p[1];
      uVar12 = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
      if ((char)bVar2 < '\0') {
        pVar15 = internal::ReadTagFallback((char *)p,uVar12);
      }
      else {
        pVar15.second = uVar12;
        pVar15.first = (char *)(p + 2);
        pVar15._12_4_ = 0;
      }
    }
    ptr = pVar15.first;
    if (ptr == (char *)0x0) {
LAB_002f0a00:
      cVar11 = '\x04';
    }
    else {
      tag = pVar15.second;
      cVar11 = (char)pVar15.second;
      switch((uint)(pVar15._8_8_ >> 3) & 0x1fffffff) {
      case 1:
        if (cVar11 != '\n') break;
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
        pAVar13 = (Arena *)(this->_internal_metadata_).
                           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                           .ptr_;
        if (((ulong)pAVar13 & 1) != 0) {
          pAVar13 = *(Arena **)(((ulong)pAVar13 & 0xfffffffffffffffe) + 0x18);
        }
        pAVar14 = this_02;
        if (this_02->ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
          internal::ArenaStringPtr::CreateInstance
                    (this_02,pAVar13,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
        }
LAB_002f0789:
        ptr = internal::InlineGreedyStringParser(pAVar14->ptr_,ptr,ctx);
        goto LAB_002f0aa2;
      case 2:
        if (cVar11 == '\x12') {
          *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
          pAVar13 = (Arena *)(this->_internal_metadata_).
                             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                             .ptr_;
          if (((ulong)pAVar13 & 1) != 0) {
            pAVar13 = *(Arena **)(((ulong)pAVar13 & 0xfffffffffffffffe) + 0x18);
          }
          pAVar14 = this_01;
          if (this_01->ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
            internal::ArenaStringPtr::CreateInstance
                      (this_01,pAVar13,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
          }
          goto LAB_002f0789;
        }
        break;
      case 3:
        if (cVar11 == '\x1a') {
          ptr = ptr + -1;
          do {
            pRVar4 = (this->dependency_).super_RepeatedPtrFieldBase.rep_;
            if (pRVar4 == (Rep *)0x0) {
LAB_002f0591:
              internal::RepeatedPtrFieldBase::Reserve
                        (&(this->dependency_).super_RepeatedPtrFieldBase,
                         (this->dependency_).super_RepeatedPtrFieldBase.total_size_ + 1);
LAB_002f059f:
              pRVar4 = (this->dependency_).super_RepeatedPtrFieldBase.rep_;
              pRVar4->allocated_size = pRVar4->allocated_size + 1;
              pAVar13 = (this->dependency_).super_RepeatedPtrFieldBase.arena_;
              if (pAVar13 == (Arena *)0x0) {
                s = (string *)operator_new(0x20);
              }
              else {
                if (pAVar13->hooks_cookie_ != (void *)0x0) {
                  Arena::OnArenaAllocation
                            (pAVar13,(type_info *)&std::__cxx11::string::typeinfo,0x20);
                }
                s = (string *)
                    internal::ArenaImpl::AllocateAlignedAndAddCleanup
                              (&pAVar13->impl_,0x20,
                               internal::arena_destruct_object<std::__cxx11::string>);
              }
              (s->_M_dataplus)._M_p = (pointer)&s->field_2;
              s->_M_string_length = 0;
              (s->field_2)._M_local_buf[0] = '\0';
              pRVar4 = (this->dependency_).super_RepeatedPtrFieldBase.rep_;
              iVar3 = (this->dependency_).super_RepeatedPtrFieldBase.current_size_;
              (this->dependency_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
              pRVar4->elements[iVar3] = s;
            }
            else {
              iVar3 = (this->dependency_).super_RepeatedPtrFieldBase.current_size_;
              if (pRVar4->allocated_size <= iVar3) {
                if (pRVar4->allocated_size ==
                    (this->dependency_).super_RepeatedPtrFieldBase.total_size_) goto LAB_002f0591;
                goto LAB_002f059f;
              }
              (this->dependency_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
              s = (string *)pRVar4->elements[iVar3];
            }
            ptr = internal::InlineGreedyStringParser(s,ptr + 1,ctx);
            if (ptr == (char *)0x0) goto LAB_002f0a00;
            cVar11 = '\x02';
          } while ((ptr < (ctx->super_EpsCopyInputStream).limit_end_) && (*ptr == '\x1a'));
          goto LAB_002f0ab4;
        }
        break;
      case 4:
        if (cVar11 == '\"') {
          ptr = ptr + -1;
          do {
            pRVar4 = (this->message_type_).super_RepeatedPtrFieldBase.rep_;
            if (pRVar4 == (Rep *)0x0) {
LAB_002f0669:
              internal::RepeatedPtrFieldBase::Reserve
                        (&(this->message_type_).super_RepeatedPtrFieldBase,
                         (this->message_type_).super_RepeatedPtrFieldBase.total_size_ + 1);
LAB_002f0679:
              pRVar4 = (this->message_type_).super_RepeatedPtrFieldBase.rep_;
              pRVar4->allocated_size = pRVar4->allocated_size + 1;
              msg_00 = Arena::CreateMaybeMessage<google::protobuf::DescriptorProto>
                                 ((this->message_type_).super_RepeatedPtrFieldBase.arena_);
              pRVar4 = (this->message_type_).super_RepeatedPtrFieldBase.rep_;
              iVar3 = (this->message_type_).super_RepeatedPtrFieldBase.current_size_;
              (this->message_type_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
              pRVar4->elements[iVar3] = msg_00;
            }
            else {
              iVar3 = (this->message_type_).super_RepeatedPtrFieldBase.current_size_;
              if (pRVar4->allocated_size <= iVar3) {
                if (pRVar4->allocated_size ==
                    (this->message_type_).super_RepeatedPtrFieldBase.total_size_) goto LAB_002f0669;
                goto LAB_002f0679;
              }
              (this->message_type_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
              msg_00 = (DescriptorProto *)pRVar4->elements[iVar3];
            }
            ptr = internal::ParseContext::ParseMessage<google::protobuf::DescriptorProto>
                            (ctx,msg_00,ptr + 1);
            if (ptr == (char *)0x0) goto LAB_002f0a00;
            cVar11 = '\x02';
          } while ((ptr < (ctx->super_EpsCopyInputStream).limit_end_) && (*ptr == '\"'));
          goto LAB_002f0ab4;
        }
        break;
      case 5:
        if (cVar11 == '*') {
          ptr = ptr + -1;
          do {
            pRVar4 = (this->enum_type_).super_RepeatedPtrFieldBase.rep_;
            if (pRVar4 == (Rep *)0x0) {
LAB_002f041e:
              internal::RepeatedPtrFieldBase::Reserve
                        (&(this->enum_type_).super_RepeatedPtrFieldBase,
                         (this->enum_type_).super_RepeatedPtrFieldBase.total_size_ + 1);
LAB_002f042e:
              pRVar4 = (this->enum_type_).super_RepeatedPtrFieldBase.rep_;
              pRVar4->allocated_size = pRVar4->allocated_size + 1;
              msg = Arena::CreateMaybeMessage<google::protobuf::EnumDescriptorProto>
                              ((this->enum_type_).super_RepeatedPtrFieldBase.arena_);
              pRVar4 = (this->enum_type_).super_RepeatedPtrFieldBase.rep_;
              iVar3 = (this->enum_type_).super_RepeatedPtrFieldBase.current_size_;
              (this->enum_type_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
              pRVar4->elements[iVar3] = msg;
            }
            else {
              iVar3 = (this->enum_type_).super_RepeatedPtrFieldBase.current_size_;
              if (pRVar4->allocated_size <= iVar3) {
                if (pRVar4->allocated_size ==
                    (this->enum_type_).super_RepeatedPtrFieldBase.total_size_) goto LAB_002f041e;
                goto LAB_002f042e;
              }
              (this->enum_type_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
              msg = (EnumDescriptorProto *)pRVar4->elements[iVar3];
            }
            ptr = internal::ParseContext::ParseMessage<google::protobuf::EnumDescriptorProto>
                            (ctx,msg,ptr + 1);
            if (ptr == (char *)0x0) goto LAB_002f0a00;
            cVar11 = '\x02';
          } while ((ptr < (ctx->super_EpsCopyInputStream).limit_end_) && (*ptr == '*'));
          goto LAB_002f0ab4;
        }
        break;
      case 6:
        if (cVar11 == '2') {
          ptr = ptr + -1;
          do {
            pRVar4 = (this->service_).super_RepeatedPtrFieldBase.rep_;
            if (pRVar4 == (Rep *)0x0) {
LAB_002f07b1:
              internal::RepeatedPtrFieldBase::Reserve
                        (&(this->service_).super_RepeatedPtrFieldBase,
                         (this->service_).super_RepeatedPtrFieldBase.total_size_ + 1);
LAB_002f07c1:
              pRVar4 = (this->service_).super_RepeatedPtrFieldBase.rep_;
              pRVar4->allocated_size = pRVar4->allocated_size + 1;
              msg_01 = Arena::CreateMaybeMessage<google::protobuf::ServiceDescriptorProto>
                                 ((this->service_).super_RepeatedPtrFieldBase.arena_);
              pRVar4 = (this->service_).super_RepeatedPtrFieldBase.rep_;
              iVar3 = (this->service_).super_RepeatedPtrFieldBase.current_size_;
              (this->service_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
              pRVar4->elements[iVar3] = msg_01;
            }
            else {
              iVar3 = (this->service_).super_RepeatedPtrFieldBase.current_size_;
              if (pRVar4->allocated_size <= iVar3) {
                if (pRVar4->allocated_size ==
                    (this->service_).super_RepeatedPtrFieldBase.total_size_) goto LAB_002f07b1;
                goto LAB_002f07c1;
              }
              (this->service_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
              msg_01 = (ServiceDescriptorProto *)pRVar4->elements[iVar3];
            }
            ptr = internal::ParseContext::ParseMessage<google::protobuf::ServiceDescriptorProto>
                            (ctx,msg_01,ptr + 1);
            if (ptr == (char *)0x0) goto LAB_002f0a00;
            cVar11 = '\x02';
          } while ((ptr < (ctx->super_EpsCopyInputStream).limit_end_) && (*ptr == '2'));
          goto LAB_002f0ab4;
        }
        break;
      case 7:
        if (cVar11 == ':') {
          ptr = ptr + -1;
          do {
            pRVar4 = (this->extension_).super_RepeatedPtrFieldBase.rep_;
            if (pRVar4 == (Rep *)0x0) {
LAB_002f085e:
              internal::RepeatedPtrFieldBase::Reserve
                        (&(this->extension_).super_RepeatedPtrFieldBase,
                         (this->extension_).super_RepeatedPtrFieldBase.total_size_ + 1);
LAB_002f0871:
              pRVar4 = (this->extension_).super_RepeatedPtrFieldBase.rep_;
              pRVar4->allocated_size = pRVar4->allocated_size + 1;
              msg_02 = Arena::CreateMaybeMessage<google::protobuf::FieldDescriptorProto>
                                 ((this->extension_).super_RepeatedPtrFieldBase.arena_);
              pRVar4 = (this->extension_).super_RepeatedPtrFieldBase.rep_;
              iVar3 = (this->extension_).super_RepeatedPtrFieldBase.current_size_;
              (this->extension_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
              pRVar4->elements[iVar3] = msg_02;
            }
            else {
              iVar3 = (this->extension_).super_RepeatedPtrFieldBase.current_size_;
              if (pRVar4->allocated_size <= iVar3) {
                if (pRVar4->allocated_size ==
                    (this->extension_).super_RepeatedPtrFieldBase.total_size_) goto LAB_002f085e;
                goto LAB_002f0871;
              }
              (this->extension_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
              msg_02 = (FieldDescriptorProto *)pRVar4->elements[iVar3];
            }
            ptr = internal::ParseContext::ParseMessage<google::protobuf::FieldDescriptorProto>
                            (ctx,msg_02,ptr + 1);
            if (ptr == (char *)0x0) goto LAB_002f0a00;
            cVar11 = '\x02';
          } while ((ptr < (ctx->super_EpsCopyInputStream).limit_end_) && (*ptr == ':'));
          goto LAB_002f0ab4;
        }
        break;
      case 8:
        if (cVar11 == 'B') {
          *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 8;
          if (this->options_ == (FileOptions *)0x0) {
            pAVar13 = (Arena *)(metadata->
                               super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                               ).ptr_;
            if (((ulong)pAVar13 & 1) != 0) {
              pAVar13 = *(Arena **)(((ulong)pAVar13 & 0xfffffffffffffffe) + 0x18);
            }
            pFVar9 = Arena::CreateMaybeMessage<google::protobuf::FileOptions>(pAVar13);
            this->options_ = pFVar9;
          }
          ptr = internal::ParseContext::ParseMessage<google::protobuf::FileOptions>
                          (ctx,this->options_,ptr);
          goto LAB_002f0aa2;
        }
        break;
      case 9:
        if (cVar11 == 'J') {
          *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 0x10;
          if (this->source_code_info_ == (SourceCodeInfo *)0x0) {
            pAVar13 = (Arena *)(metadata->
                               super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                               ).ptr_;
            if (((ulong)pAVar13 & 1) != 0) {
              pAVar13 = *(Arena **)(((ulong)pAVar13 & 0xfffffffffffffffe) + 0x18);
            }
            pSVar10 = Arena::CreateMaybeMessage<google::protobuf::SourceCodeInfo>(pAVar13);
            this->source_code_info_ = pSVar10;
          }
          ptr = internal::ParseContext::ParseMessage<google::protobuf::SourceCodeInfo>
                          (ctx,this->source_code_info_,ptr);
          goto LAB_002f0aa2;
        }
        break;
      case 10:
        if (cVar11 == 'P') {
          ptr = ptr + -1;
          do {
            bVar1 = ptr[1];
            if ((long)(char)bVar1 < 0) {
              bVar2 = ptr[2];
              uVar12 = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
              if ((char)bVar2 < '\0') {
                pVar16 = internal::VarintParseSlow64(ptr + 1,uVar12);
                auVar7 = pVar16._0_12_;
              }
              else {
                auVar7._8_4_ = uVar12;
                auVar7._0_8_ = ptr + 3;
              }
            }
            else {
              auVar5._8_8_ = (long)(char)bVar1;
              auVar5._0_8_ = ptr + 2;
              auVar7 = auVar5._0_12_;
            }
            ptr = auVar7._0_8_;
            iVar3 = (this->public_dependency_).total_size_;
            if ((this->public_dependency_).current_size_ == iVar3) {
              RepeatedField<int>::Reserve(&this->public_dependency_,iVar3 + 1);
            }
            iVar3 = (this->public_dependency_).current_size_;
            (this->public_dependency_).current_size_ = iVar3 + 1;
            *(int *)((long)(this->public_dependency_).arena_or_elements_ + (long)iVar3 * 4) =
                 auVar7._8_4_;
            if (ptr == (char *)0x0) goto LAB_002f0a00;
          } while ((ptr < (ctx->super_EpsCopyInputStream).limit_end_) && (*ptr == 'P'));
        }
        else {
          object = &this->public_dependency_;
          if ((tag & 0xff) != 0x52) break;
LAB_002f0a52:
          ptr = internal::PackedInt32Parser(object,ptr,ctx);
          cVar11 = '\x04';
          if (ptr == (char *)0x0) goto LAB_002f0ab4;
        }
LAB_002f09a9:
        cVar11 = '\x02';
        goto LAB_002f0ab4;
      case 0xb:
        if (cVar11 == 'X') {
          ptr = ptr + -1;
          do {
            bVar1 = ptr[1];
            if ((long)(char)bVar1 < 0) {
              bVar2 = ptr[2];
              uVar12 = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
              if ((char)bVar2 < '\0') {
                pVar16 = internal::VarintParseSlow64(ptr + 1,uVar12);
                auVar8 = pVar16._0_12_;
              }
              else {
                auVar8._8_4_ = uVar12;
                auVar8._0_8_ = ptr + 3;
              }
            }
            else {
              auVar6._8_8_ = (long)(char)bVar1;
              auVar6._0_8_ = ptr + 2;
              auVar8 = auVar6._0_12_;
            }
            ptr = auVar8._0_8_;
            iVar3 = (this->weak_dependency_).total_size_;
            if ((this->weak_dependency_).current_size_ == iVar3) {
              RepeatedField<int>::Reserve(&this->weak_dependency_,iVar3 + 1);
            }
            iVar3 = (this->weak_dependency_).current_size_;
            (this->weak_dependency_).current_size_ = iVar3 + 1;
            *(int *)((long)(this->weak_dependency_).arena_or_elements_ + (long)iVar3 * 4) =
                 auVar8._8_4_;
            if (ptr == (char *)0x0) goto LAB_002f0a00;
          } while ((ptr < (ctx->super_EpsCopyInputStream).limit_end_) && (*ptr == 'X'));
          goto LAB_002f09a9;
        }
        object = &this->weak_dependency_;
        if ((tag & 0xff) == 0x5a) goto LAB_002f0a52;
        break;
      case 0xc:
        if (cVar11 == 'b') {
          *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 4;
          pAVar13 = (Arena *)(this->_internal_metadata_).
                             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                             .ptr_;
          if (((ulong)pAVar13 & 1) != 0) {
            pAVar13 = *(Arena **)(((ulong)pAVar13 & 0xfffffffffffffffe) + 0x18);
          }
          pAVar14 = this_00;
          if (this_00->ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
            internal::ArenaStringPtr::CreateInstance
                      (this_00,pAVar13,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
          }
          goto LAB_002f0789;
        }
      }
      if (tag == 0 || (tag & 7) == 4) {
        (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = tag - 1;
        cVar11 = '\x15';
      }
      else {
        ptr = internal::UnknownFieldParse(tag,metadata,ptr,ctx);
LAB_002f0aa2:
        cVar11 = (ptr == (char *)0x0) * '\x02' + '\x02';
      }
    }
LAB_002f0ab4:
    if (cVar11 != '\x02') {
      if (cVar11 == '\x04') {
        ptr = (char *)0x0;
      }
      return ptr;
    }
  } while( true );
}

Assistant:

const char* FileDescriptorProto::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  ::PROTOBUF_NAMESPACE_ID::Arena* arena = GetArenaNoVirtual(); (void)arena;
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // optional string name = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 10)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_name(), ptr, ctx, "google.protobuf.FileDescriptorProto.name");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional string package = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 18)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_package(), ptr, ctx, "google.protobuf.FileDescriptorProto.package");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // repeated string dependency = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 26)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_add_dependency(), ptr, ctx, "google.protobuf.FileDescriptorProto.dependency");
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<26>(ptr));
        } else goto handle_unusual;
        continue;
      // repeated .google.protobuf.DescriptorProto message_type = 4;
      case 4:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 34)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_message_type(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<34>(ptr));
        } else goto handle_unusual;
        continue;
      // repeated .google.protobuf.EnumDescriptorProto enum_type = 5;
      case 5:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 42)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_enum_type(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<42>(ptr));
        } else goto handle_unusual;
        continue;
      // repeated .google.protobuf.ServiceDescriptorProto service = 6;
      case 6:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 50)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_service(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<50>(ptr));
        } else goto handle_unusual;
        continue;
      // repeated .google.protobuf.FieldDescriptorProto extension = 7;
      case 7:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 58)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_extension(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<58>(ptr));
        } else goto handle_unusual;
        continue;
      // optional .google.protobuf.FileOptions options = 8;
      case 8:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 66)) {
          ptr = ctx->ParseMessage(_internal_mutable_options(), ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional .google.protobuf.SourceCodeInfo source_code_info = 9;
      case 9:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 74)) {
          ptr = ctx->ParseMessage(_internal_mutable_source_code_info(), ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // repeated int32 public_dependency = 10;
      case 10:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 80)) {
          ptr -= 1;
          do {
            ptr += 1;
            _internal_add_public_dependency(::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr));
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<80>(ptr));
        } else if (static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 82) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::PackedInt32Parser(_internal_mutable_public_dependency(), ptr, ctx);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // repeated int32 weak_dependency = 11;
      case 11:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 88)) {
          ptr -= 1;
          do {
            ptr += 1;
            _internal_add_weak_dependency(::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr));
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<88>(ptr));
        } else if (static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 90) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::PackedInt32Parser(_internal_mutable_weak_dependency(), ptr, ctx);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional string syntax = 12;
      case 12:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 98)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_syntax(), ptr, ctx, "google.protobuf.FileDescriptorProto.syntax");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
        ptr = UnknownFieldParse(tag, &_internal_metadata_, ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}